

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
duckdb_fmt::v6::internal::
parse_format_string<false,wchar_t,duckdb_fmt::v6::format_handler<duckdb_fmt::v6::arg_formatter<duckdb_fmt::v6::buffer_range<wchar_t>>,wchar_t,duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<wchar_t>>,wchar_t>>&>
          (internal *this,basic_string_view<wchar_t> format_str,
          format_handler<duckdb_fmt::v6::arg_formatter<duckdb_fmt::v6::buffer_range<wchar_t>_>,_wchar_t,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
          *handler)

{
  ulong uVar1;
  internal *end;
  wchar_t wVar2;
  buffer<wchar_t> *pbVar3;
  size_t sVar4;
  internal *piVar5;
  internal *piVar6;
  format_handler<duckdb_fmt::v6::arg_formatter<duckdb_fmt::v6::buffer_range<wchar_t>_>,_wchar_t,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
  *this_00;
  anon_union_16_15_055d57a1_for_value<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>_1
  *this_01;
  string *psVar7;
  buffer<wchar_t> *c;
  internal *piVar8;
  undefined1 local_b0 [32];
  string local_90;
  string local_70;
  anon_union_16_15_055d57a1_for_value<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>_1
  local_50;
  undefined1 local_40 [16];
  
  this_00 = (format_handler<duckdb_fmt::v6::arg_formatter<duckdb_fmt::v6::buffer_range<wchar_t>_>,_wchar_t,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
             *)format_str.size_;
  if (format_str.data_ == (wchar_t *)0x0) {
    return;
  }
  end = this + (long)format_str.data_ * 4;
  do {
    wVar2 = *(wchar_t *)this;
    piVar6 = this;
    while (wVar2 != L'{') {
      piVar6 = piVar6 + 4;
      piVar8 = this;
      if (piVar6 == end) goto LAB_01190c9e;
      wVar2 = *(wchar_t *)piVar6;
    }
    piVar8 = this;
    if (this != piVar6) {
      do {
        while (piVar5 = piVar8, piVar8 = piVar5 + 4, *(wchar_t *)piVar5 == L'}') {
          if ((piVar8 == piVar6) || (*(int *)piVar8 != 0x7d)) {
            local_b0._0_8_ = local_b0 + 0x10;
            psVar7 = (string *)local_b0;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_b0,"unmatched \'}\' in format string","");
            error_handler::on_error((error_handler *)psVar7,(string *)local_b0);
          }
          format_handler<duckdb_fmt::v6::arg_formatter<duckdb_fmt::v6::buffer_range<wchar_t>_>,_wchar_t,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
          ::on_text(this_00,(wchar_t *)this,(wchar_t *)piVar8);
          this = piVar5 + 8;
          piVar8 = this;
          if (this == piVar6) {
            this = piVar5 + 8;
            goto LAB_01190bbb;
          }
        }
      } while (piVar8 != piVar6);
LAB_01190bbb:
      format_handler<duckdb_fmt::v6::arg_formatter<duckdb_fmt::v6::buffer_range<wchar_t>_>,_wchar_t,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
      ::on_text(this_00,(wchar_t *)this,(wchar_t *)piVar6);
    }
    piVar6 = piVar6 + 4;
    if (piVar6 == end) {
      local_50.pointer = local_40;
      this_01 = &local_50;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"invalid format string","");
      error_handler::on_error((error_handler *)&this_01->string,(string *)&local_50.string);
    }
    if ((char)*(int *)piVar6 == '}') {
      format_handler<duckdb_fmt::v6::arg_formatter<duckdb_fmt::v6::buffer_range<wchar_t>_>,_wchar_t,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
      ::on_arg_id(this_00);
LAB_01190be3:
      format_handler<duckdb_fmt::v6::arg_formatter<duckdb_fmt::v6::buffer_range<wchar_t>_>,_wchar_t,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
      ::on_replacement_field(this_00,(wchar_t *)piVar6);
    }
    else if (*(int *)piVar6 == 0x7b) {
      pbVar3 = (this_00->context).out_.container;
      sVar4 = pbVar3->size_;
      uVar1 = sVar4 + 1;
      if (pbVar3->capacity_ < uVar1) {
        (**pbVar3->_vptr_buffer)(pbVar3,uVar1);
      }
      pbVar3->size_ = uVar1;
      pbVar3->ptr_[sVar4] = *(wchar_t *)piVar6;
      (this_00->context).out_.container = pbVar3;
    }
    else {
      local_b0._0_8_ = this_00;
      piVar6 = (internal *)
               parse_arg_id<wchar_t,duckdb_fmt::v6::internal::id_adapter<duckdb_fmt::v6::format_handler<duckdb_fmt::v6::arg_formatter<duckdb_fmt::v6::buffer_range<wchar_t>>,wchar_t,duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<wchar_t>>,wchar_t>>&,wchar_t>>
                         ((wchar_t *)piVar6,(wchar_t *)end,
                          (id_adapter<duckdb_fmt::v6::format_handler<duckdb_fmt::v6::arg_formatter<duckdb_fmt::v6::buffer_range<wchar_t>_>,_wchar_t,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>_&,_wchar_t>
                           *)local_b0);
      if (piVar6 == end) {
LAB_01190d82:
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        psVar7 = &local_90;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_90,"missing \'}\' in format string","");
        error_handler::on_error((error_handler *)psVar7,&local_90);
      }
      if (*(wchar_t *)piVar6 != L':') {
        if (*(wchar_t *)piVar6 != L'}') goto LAB_01190d82;
        goto LAB_01190be3;
      }
      piVar6 = (internal *)
               format_handler<duckdb_fmt::v6::arg_formatter<duckdb_fmt::v6::buffer_range<wchar_t>_>,_wchar_t,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
               ::on_format_specs(this_00,(wchar_t *)(piVar6 + 4),(wchar_t *)end);
      if ((piVar6 == end) || (*(wchar_t *)piVar6 != L'}')) {
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        psVar7 = &local_70;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_70,"unknown format specifier","");
        error_handler::on_error((error_handler *)psVar7,&local_70);
      }
    }
    this = piVar6 + 4;
    if (this == end) {
      return;
    }
  } while( true );
LAB_01190c9e:
  piVar6 = piVar8;
  piVar8 = piVar6 + 4;
  if (*(wchar_t *)piVar6 == L'}') {
    if ((piVar8 == end) || (*(int *)piVar8 != 0x7d)) {
      local_b0._0_8_ = local_b0 + 0x10;
      psVar7 = (string *)local_b0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_b0,"unmatched \'}\' in format string","");
      error_handler::on_error((error_handler *)psVar7,(string *)local_b0);
    }
    format_handler<duckdb_fmt::v6::arg_formatter<duckdb_fmt::v6::buffer_range<wchar_t>_>,_wchar_t,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
    ::on_text(this_00,(wchar_t *)this,(wchar_t *)piVar8);
    this = piVar6 + 8;
    piVar8 = this;
    if (this == end) {
      this = piVar6 + 8;
      goto LAB_01190ce1;
    }
    goto LAB_01190c9e;
  }
  if (piVar8 == end) {
LAB_01190ce1:
    format_handler<duckdb_fmt::v6::arg_formatter<duckdb_fmt::v6::buffer_range<wchar_t>_>,_wchar_t,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
    ::on_text(this_00,(wchar_t *)this,(wchar_t *)end);
    return;
  }
  goto LAB_01190c9e;
}

Assistant:

FMT_CONSTEXPR void parse_format_string(basic_string_view<Char> format_str,
                                       Handler&& handler) {
  struct pfs_writer {
    FMT_CONSTEXPR void operator()(const Char* begin, const Char* end) {
      if (begin == end) return;
      for (;;) {
        const Char* p = nullptr;
        if (!find<IS_CONSTEXPR>(begin, end, '}', p))
          return handler_.on_text(begin, end);
        ++p;
        if (p == end || *p != '}')
          return handler_.on_error("unmatched '}' in format string");
        handler_.on_text(begin, p);
        begin = p + 1;
      }
    }
    Handler& handler_;
  } write{handler};
  auto begin = format_str.data();
  auto end = begin + format_str.size();
  while (begin != end) {
    // Doing two passes with memchr (one for '{' and another for '}') is up to
    // 2.5x faster than the naive one-pass implementation on big format strings.
    const Char* p = begin;
    if (*begin != '{' && !find<IS_CONSTEXPR>(begin, end, '{', p))
      return write(begin, end);
    write(begin, p);
    ++p;
    if (p == end) return handler.on_error("invalid format string");
    if (static_cast<char>(*p) == '}') {
      handler.on_arg_id();
      handler.on_replacement_field(p);
    } else if (*p == '{') {
      handler.on_text(p, p + 1);
    } else {
      p = parse_arg_id(p, end, id_adapter<Handler, Char>{handler});
      Char c = p != end ? *p : Char();
      if (c == '}') {
        handler.on_replacement_field(p);
      } else if (c == ':') {
        p = handler.on_format_specs(p + 1, end);
        if (p == end || *p != '}')
          return handler.on_error("unknown format specifier");
      } else {
        return handler.on_error("missing '}' in format string");
      }
    }
    begin = p + 1;
  }
}